

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_106ef0::readWriteTestWithAbsoluateCoordinates
               (int channelCount,int testTimes,string *tempDir)

{
  ostream *poVar1;
  int i;
  Compression compression;
  undefined4 in_register_00000034;
  string fn;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,channelCount);
  poVar1 = std::operator<<(poVar1," channels, using absolute coordinates ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1," times.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  std::operator+(&fn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_00000034,testTimes),"imf_test_deep_tiled_basic.exr");
  for (compression = NO_COMPRESSION; compression != ZIPS_COMPRESSION;
      compression = compression + RLE_COMPRESSION) {
    generateRandomFile(channelCount,compression,false,false,&fn);
    readFile(channelCount,false,false,false,&fn);
    readFile(channelCount,false,false,true,&fn);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    generateRandomFile(channelCount,compression,true,false,&fn);
    readFile(channelCount,true,false,false,&fn);
    readFile(channelCount,true,false,true,&fn);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    generateRandomFile(channelCount,compression,false,true,&fn);
    readFile(channelCount,false,true,false,&fn);
    readFile(channelCount,false,true,true,&fn);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
  }
  std::__cxx11::string::~string((string *)&fn);
  return;
}

Assistant:

void
readWriteTestWithAbsoluateCoordinates (
    int channelCount, int testTimes, const std::string& tempDir)
{
    cout << "Testing files with " << channelCount
         << " channels, using absolute coordinates " << testTimes << " times."
         << endl
         << flush;

    std::string fn = tempDir + "imf_test_deep_tiled_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, false, false, fn);
        readFile (channelCount, false, false, false, fn);
        readFile (channelCount, false, false, true, fn);
        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, true, false, fn);
        readFile (channelCount, true, false, false, fn);
        readFile (channelCount, true, false, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, false, true, fn);
        readFile (channelCount, false, true, false, fn);
        readFile (channelCount, false, true, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;
    }
}